

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_diag(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  size_t __n;
  size_t __n_00;
  void *__s;
  void *__s_00;
  long local_d8;
  long local_c0;
  long local_b0;
  long local_a8;
  long local_98;
  long local_90;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x11c2,"fatal error");
  }
  if (params->ith != 0) {
    return;
  }
  lVar3 = pgVar2->ne[0];
  if (lVar3 == dst->ne[0]) {
    if (lVar3 == dst->ne[1]) {
      if (pgVar2->ne[1] == 1) {
        lVar4 = pgVar2->ne[2];
        if (lVar4 == dst->ne[2]) {
          lVar5 = pgVar2->ne[3];
          if (lVar5 == dst->ne[3]) {
            if (pgVar2->nb[0] == 4) {
              if (dst->nb[0] == 4) {
                if (lVar5 < 1) {
                  return;
                }
                local_b0 = 0;
                local_d8 = 0;
                sVar6 = pgVar2->nb[2];
                sVar7 = pgVar2->nb[3];
                sVar8 = dst->nb[2];
                sVar9 = dst->nb[1];
                sVar10 = dst->nb[3];
                lVar15 = 0;
                local_a8 = 4;
                do {
                  if (0 < lVar4) {
                    lVar14 = 0;
                    local_90 = local_b0;
                    local_c0 = local_d8;
                    local_98 = local_a8;
                    do {
                      if (0 < lVar3) {
                        lVar13 = 1;
                        __n = 0;
                        pvVar11 = pgVar2->data;
                        __s_00 = (void *)((long)dst->data + local_98);
                        __s = (void *)((long)dst->data + local_90);
                        __n_00 = lVar3 * 4;
                        do {
                          __n_00 = __n_00 - 4;
                          if (lVar13 != 1) {
                            memset(__s,0,__n);
                          }
                          *(undefined4 *)((long)__s_00 + -4) =
                               *(undefined4 *)((long)pvVar11 + lVar13 * 4 + local_c0 + -4);
                          if (lVar13 < lVar3) {
                            memset(__s_00,0,__n_00);
                          }
                          __s_00 = (void *)((long)__s_00 + sVar9 + 4);
                          __s = (void *)((long)__s + sVar9);
                          __n = __n + 4;
                          lVar1 = (1 - lVar3) + lVar13;
                          lVar13 = lVar13 + 1;
                        } while (lVar1 != 1);
                      }
                      local_c0 = local_c0 + sVar6;
                      local_98 = local_98 + sVar8;
                      local_90 = local_90 + sVar8;
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != lVar4);
                  }
                  local_d8 = local_d8 + sVar7;
                  local_a8 = local_a8 + sVar10;
                  local_b0 = local_b0 + sVar10;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != lVar5);
                return;
              }
              pcVar12 = "nb0 == sizeof(float)";
              uVar16 = 0x11a2;
            }
            else {
              pcVar12 = "nb00 == sizeof(float)";
              uVar16 = 0x11a1;
            }
          }
          else {
            pcVar12 = "ne03 == ne3";
            uVar16 = 0x119f;
          }
        }
        else {
          pcVar12 = "ne02 == ne2";
          uVar16 = 0x119e;
        }
      }
      else {
        pcVar12 = "ne01 == 1";
        uVar16 = 0x119d;
      }
    }
    else {
      pcVar12 = "ne00 == ne1";
      uVar16 = 0x119c;
    }
  }
  else {
    pcVar12 = "ne00 == ne0";
    uVar16 = 0x119b;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar12);
}

Assistant:

void ggml_compute_forward_diag(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_diag_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}